

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

undefined8
StringBuilder<char[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
          (char (*arg) [2],char *args,char (*args_1) [2],unsigned_long *args_2,char (*args_3) [2],
          char *args_4,char (*args_5) [2],unsigned_long *args_6,char (*args_7) [2],char *args_8,
          char (*args_9) [2],unsigned_long *args_10,char (*args_11) [2],char *args_12,
          char (*args_13) [2])

{
  char *in_RCX;
  unsigned_long *unaff_RBP;
  undefined8 in_RDI;
  char (*in_R8) [2];
  unsigned_long *in_R9;
  char (*unaff_R15) [2];
  char (*unaff_retaddr) [2];
  char *in_stack_00000008;
  char (*in_stack_00000010) [2];
  unsigned_long *in_stack_00000018;
  char (*in_stack_00000020) [2];
  char *in_stack_00000028;
  char (*in_stack_00000030) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000048;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000050;
  char *in_stack_ffffffffffffff18;
  string local_a0 [32];
  string local_80 [16];
  char *in_stack_ffffffffffffff90;
  char (*in_stack_ffffffffffffff98) [2];
  
  StringBuilder_abi_cxx11_(in_stack_ffffffffffffff18);
  StringBuilder<char,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,unaff_R15,
             unaff_RBP,unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
             in_stack_00000020,in_stack_00000028,in_stack_00000030);
  std::operator+(in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_80);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}